

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

void __thiscall QTableViewPrivate::selectColumn(QTableViewPrivate *this,int column,bool anchor)

{
  QPersistentModelIndex *this_00;
  QPersistentModelIndex *this_01;
  QAbstractItemView *this_02;
  QAbstractItemModel *pQVar1;
  Data *pDVar2;
  int iVar3;
  QRect QVar4;
  QRect QVar5;
  bool bVar6;
  SelectionBehavior SVar7;
  SelectionMode SVar8;
  int iVar9;
  int iVar10;
  qsizetype qVar11;
  QObject *pQVar12;
  long in_FS_OFFSET;
  QPersistentModelIndex startIndex;
  SelectionFlag local_ec;
  QRect local_d0;
  QRect local_c0;
  undefined1 local_b0 [16];
  undefined8 local_98;
  undefined1 *puStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  undefined8 local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = *(QAbstractItemView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  SVar7 = QAbstractItemView::selectionBehavior(this_02);
  QVar5.x2.m_i = local_c0.x2.m_i;
  QVar5.y2.m_i = local_c0.y2.m_i;
  QVar5.x1.m_i = local_c0.x1.m_i;
  QVar5.y1.m_i = local_c0.y1.m_i;
  QVar4.x2.m_i = local_d0.x2.m_i;
  QVar4.y2.m_i = local_d0.y2.m_i;
  QVar4.x1.m_i = local_d0.x1.m_i;
  QVar4.y1.m_i = local_d0.y1.m_i;
  if (SVar7 != SelectRows) {
    SVar8 = QAbstractItemView::selectionMode(this_02);
    if (SVar8 == SingleSelection) {
      SVar7 = QAbstractItemView::selectionBehavior(this_02);
      QVar5.x2.m_i = local_c0.x2.m_i;
      QVar5.y2.m_i = local_c0.y2.m_i;
      QVar5.x1.m_i = local_c0.x1.m_i;
      QVar5.y1.m_i = local_c0.y1.m_i;
      QVar4.x2.m_i = local_d0.x2.m_i;
      QVar4.y2.m_i = local_d0.y2.m_i;
      QVar4.x1.m_i = local_d0.x1.m_i;
      QVar4.y1.m_i = local_d0.y1.m_i;
      if (SVar7 == SelectItems) goto LAB_00598249;
    }
    QVar5.x2.m_i = local_c0.x2.m_i;
    QVar5.y2.m_i = local_c0.y2.m_i;
    QVar5.x1.m_i = local_c0.x1.m_i;
    QVar5.y1.m_i = local_c0.y1.m_i;
    QVar4.x2.m_i = local_d0.x2.m_i;
    QVar4.y2.m_i = local_d0.y2.m_i;
    QVar4.x1.m_i = local_d0.x1.m_i;
    QVar4.y1.m_i = local_d0.y1.m_i;
    if (-1 < column) {
      pQVar1 = (this->super_QAbstractItemViewPrivate).model;
      this_00 = &(this->super_QAbstractItemViewPrivate).root;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
      iVar9 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1);
      QVar5.x2.m_i = local_c0.x2.m_i;
      QVar5.y2.m_i = local_c0.y2.m_i;
      QVar5.x1.m_i = local_c0.x1.m_i;
      QVar5.y1.m_i = local_c0.y1.m_i;
      QVar4.x2.m_i = local_d0.x2.m_i;
      QVar4.y2.m_i = local_d0.y2.m_i;
      QVar4.x1.m_i = local_d0.x1.m_i;
      QVar4.y1.m_i = local_d0.y1.m_i;
      if (column < iVar9) {
        iVar9 = QHeaderView::logicalIndexAt(this->verticalHeader,0);
        local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar1 = (this->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_78,this_00);
        (**(code **)(*(long *)pQVar1 + 0x60))(&local_58,pQVar1,iVar9,column,&local_78);
        local_ec = (**(code **)(*(long *)this_02 + 0x2e8))(this_02,&local_58,0);
        local_78 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        this_01 = &(this->super_QAbstractItemViewPrivate).currentSelectionStartIndex;
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_78,this_01);
        pQVar12 = (this->super_QAbstractItemViewPrivate).selectionModel.wp.value;
        (**(code **)(*(long *)pQVar12 + 0x60))(pQVar12,&local_58,0);
        QPersistentModelIndex::operator=(this_01,(QPersistentModelIndex *)&local_78);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_78);
        if (((anchor) && ((local_ec & Current) == NoUpdate)) ||
           (SVar8 = QAbstractItemView::selectionMode(this_02), SVar8 == SingleSelection)) {
          pQVar1 = (this->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_98,this_00);
          (**(code **)(*(long *)pQVar1 + 0x60))
                    ((QModelIndex *)&local_78,pQVar1,iVar9,column,(QModelIndex *)&local_98);
          QPersistentModelIndex::operator=(this_01,(QModelIndex *)&local_78);
        }
        SVar8 = QAbstractItemView::selectionMode(this_02);
        if ((SVar8 != SingleSelection) && ((local_ec & Toggle) != NoUpdate)) {
          if (anchor) {
            QAbstractItemView::selectionModel((QAbstractItemView *)this->horizontalHeader);
            QItemSelectionModel::selectedColumns((int)(QList<QModelIndex> *)&local_78);
            qVar11 = QtPrivate::indexOf<QModelIndex,QModelIndex>
                               ((QList<QModelIndex> *)&local_78,(QModelIndex *)&local_58,0);
            (this->super_QAbstractItemViewPrivate).ctrlDragSelectionFlag =
                 (uint)(qVar11 != -1) * 2 + Select;
            if ((QArrayData *)local_78 != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&local_78->field_0x0)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&local_78->field_0x0)->_q_value).super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&local_78->field_0x0)->_q_value).super___atomic_base<int>.
                  _M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_78,0x18,0x10);
              }
            }
            local_ec = local_ec & ~Toggle |
                       (this->super_QAbstractItemViewPrivate).ctrlDragSelectionFlag;
          }
          else {
            local_ec = local_ec & ~ToggleCurrent |
                       (this->super_QAbstractItemViewPrivate).ctrlDragSelectionFlag | Current;
          }
        }
        iVar10 = QPersistentModelIndex::column();
        local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar1 = (this->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_98,this_00);
        iVar3 = column;
        if (iVar10 < column) {
          iVar3 = iVar10;
        }
        if (column < iVar10) {
          column = iVar10;
        }
        (**(code **)(*(long *)pQVar1 + 0x60))(&local_78,pQVar1,iVar9,iVar3,(QModelIndex *)&local_98)
        ;
        local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar1 = (this->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)local_b0,this_00);
        (**(code **)(*(long *)pQVar1 + 0x60))(&local_98,pQVar1,iVar9,column,(QModelIndex *)local_b0)
        ;
        bVar6 = QHeaderView::sectionsMoved(this->horizontalHeader);
        if (bVar6) {
          if (local_78._4_4_ != local_98._4_4_) {
            local_c0 = (QRect)(**(code **)(*(long *)this_02 + 0x1e0))(this_02,&local_78);
            local_d0 = (QRect)(**(code **)(*(long *)this_02 + 0x1e0))(this_02,&local_98);
            local_b0 = QRect::operator|(&local_c0,&local_d0);
            (**(code **)(*(long *)this_02 + 0x2c8))(this_02,local_b0,local_ec | Columns);
            QVar4 = local_d0;
            QVar5 = local_c0;
            goto LAB_00598249;
          }
        }
        pDVar2 = (this->super_QAbstractItemViewPrivate).selectionModel.wp.d;
        if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
          pQVar12 = (QObject *)0x0;
        }
        else {
          pQVar12 = (this->super_QAbstractItemViewPrivate).selectionModel.wp.value;
        }
        QItemSelection::QItemSelection
                  ((QItemSelection *)local_b0,(QModelIndex *)&local_78,(QModelIndex *)&local_98);
        (**(code **)(*(long *)pQVar12 + 0x70))
                  (pQVar12,(QArrayDataPointer<QItemSelectionRange> *)local_b0,local_ec | Columns);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
                  ((QArrayDataPointer<QItemSelectionRange> *)local_b0);
        QVar5.x2.m_i = local_c0.x2.m_i;
        QVar5.y2.m_i = local_c0.y2.m_i;
        QVar5.x1.m_i = local_c0.x1.m_i;
        QVar5.y1.m_i = local_c0.y1.m_i;
        QVar4.x2.m_i = local_d0.x2.m_i;
        QVar4.y2.m_i = local_d0.y2.m_i;
        QVar4.x1.m_i = local_d0.x1.m_i;
        QVar4.y1.m_i = local_d0.y1.m_i;
      }
    }
  }
LAB_00598249:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    local_d0 = QVar4;
    local_c0 = QVar5;
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableViewPrivate::selectColumn(int column, bool anchor)
{
    Q_Q(QTableView);

    if (q->selectionBehavior() == QTableView::SelectRows
        || (q->selectionMode() == QTableView::SingleSelection
            && q->selectionBehavior() == QTableView::SelectItems))
        return;

    if (column >= 0 && column < model->columnCount(root)) {
        int row = verticalHeader->logicalIndexAt(0);
        QModelIndex index = model->index(row, column, root);
        QItemSelectionModel::SelectionFlags command = q->selectionCommand(index);

        {
            // currentSelectionStartIndex gets modified inside QAbstractItemView::currentChanged()
            const auto startIndex = currentSelectionStartIndex;
            selectionModel->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
            currentSelectionStartIndex = startIndex;
        }

        if ((anchor && !(command & QItemSelectionModel::Current))
            || (q->selectionMode() == QTableView::SingleSelection))
            currentSelectionStartIndex = model->index(row, column, root);

        if (q->selectionMode() != QTableView::SingleSelection
            && command.testFlag(QItemSelectionModel::Toggle)) {
            if (anchor)
                ctrlDragSelectionFlag = horizontalHeader->selectionModel()->selectedColumns(row).contains(index)
                                    ? QItemSelectionModel::Deselect : QItemSelectionModel::Select;
            command &= ~QItemSelectionModel::Toggle;
            command |= ctrlDragSelectionFlag;
            if (!anchor)
                command |= QItemSelectionModel::Current;
        }

        const auto columnSectionAnchor = currentSelectionStartIndex.column();
        QModelIndex left = model->index(row, qMin(columnSectionAnchor, column), root);
        QModelIndex right = model->index(row, qMax(columnSectionAnchor, column), root);
        if ((horizontalHeader->sectionsMoved() && left.column() != right.column())) {
            q->setSelection(q->visualRect(left) | q->visualRect(right), command | QItemSelectionModel::Columns);
        } else {
            selectionModel->select(QItemSelection(left, right), command | QItemSelectionModel::Columns);
        }
    }
}